

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int tjPlaneHeight(int componentID,int height,int subsamp)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  if (((0 < height && (uint)subsamp < 6) && (-1 < componentID)) &&
     ((uint)componentID < (uint)(subsamp != 3) * 2 + 1)) {
    iVar1 = tjMCUHeight[(uint)subsamp];
    iVar2 = iVar1 + 7;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    uVar3 = -(iVar2 >> 3) & (height + (iVar2 >> 3)) - 1U;
    if (componentID != 0) {
      uVar3 = (int)(uVar3 << 3) / iVar1;
    }
    return uVar3;
  }
  builtin_strncpy((char *)(in_FS_OFFSET + -0xc0)," Invalid",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xb8)," argumen",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjPlaneH",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -200),"eight():",8);
  *(undefined2 *)(in_FS_OFFSET + -0xb0) = 0x74;
  return -1;
}

Assistant:

DLLEXPORT int tjPlaneHeight(int componentID, int height, int subsamp)
{
  int ph, nc, retval = 0;

  if (height < 1 || subsamp < 0 || subsamp >= TJ_NUMSAMP)
    THROWG("tjPlaneHeight(): Invalid argument");
  nc = (subsamp == TJSAMP_GRAY ? 1 : 3);
  if (componentID < 0 || componentID >= nc)
    THROWG("tjPlaneHeight(): Invalid argument");

  ph = PAD(height, tjMCUHeight[subsamp] / 8);
  if (componentID == 0)
    retval = ph;
  else
    retval = ph * 8 / tjMCUHeight[subsamp];

bailout:
  return retval;
}